

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

_Bool ts_lex_keywords(TSLexer *lexer,TSStateId state)

{
  int iVar1;
  _Bool _Var2;
  undefined8 uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined2 in_SI;
  int *in_RDI;
  _Bool result;
  int32_t lookahead;
  _Bool skip;
  _Bool eof;
  undefined2 local_1a;
  undefined1 local_2;
  
  _Var2 = false;
  local_1a = in_SI;
  do {
    local_2 = 0;
    iVar1 = *in_RDI;
    (**(code **)(in_RDI + 10))();
    uVar3 = extraout_RDX;
    switch(local_1a) {
    case 0:
      if (iVar1 == 0x41) {
        local_1a = 1;
      }
      else if (iVar1 == 0x45) {
        local_1a = 2;
      }
      else if (iVar1 == 0x4b) {
        local_1a = 3;
      }
      else if (iVar1 == 0x4c) {
        local_1a = 4;
      }
      else if (iVar1 == 0x50) {
        local_1a = 5;
      }
      else if (iVar1 == 0x51) {
        local_1a = 6;
      }
      else if (iVar1 == 0x55) {
        local_1a = 7;
      }
      else if (iVar1 == 0x5c) {
        local_2 = 1;
        local_1a = 8;
      }
      else if (iVar1 == 0x61) {
        local_1a = 9;
      }
      else if (iVar1 == 99) {
        local_1a = 10;
      }
      else if (iVar1 == 100) {
        local_1a = 0xb;
      }
      else if (iVar1 == 0x65) {
        local_1a = 0xc;
      }
      else if (iVar1 == 0x66) {
        local_1a = 0xd;
      }
      else if (iVar1 == 0x69) {
        local_1a = 0xe;
      }
      else if (iVar1 == 0x6b) {
        local_1a = 0xf;
      }
      else if (iVar1 == 0x6c) {
        local_1a = 0x10;
      }
      else if (iVar1 == 0x72) {
        local_1a = 0x11;
      }
      else if (iVar1 == 0x73) {
        local_1a = 0x12;
      }
      else if (iVar1 == 0x74) {
        local_1a = 0x13;
      }
      else if (iVar1 == 0x75) {
        local_1a = 0x14;
      }
      else if (iVar1 == 0x77) {
        local_1a = 0x15;
      }
      else {
        if (((iVar1 < 9) || (0xd < iVar1)) && (iVar1 != 0x20)) {
          return _Var2;
        }
        local_2 = 1;
        local_1a = 0x16;
      }
      break;
    case 1:
      *(undefined2 *)(in_RDI + 1) = 0x89;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 2:
      *(undefined2 *)(in_RDI + 1) = 0x87;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 3:
      *(undefined2 *)(in_RDI + 1) = 0x8a;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 4:
      *(undefined2 *)(in_RDI + 1) = 0x85;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 5:
      *(undefined2 *)(in_RDI + 1) = 0x88;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 6:
      *(undefined2 *)(in_RDI + 1) = 0x86;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 7:
      *(undefined2 *)(in_RDI + 1) = 0x83;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 8:
      if (iVar1 == 0xd) {
        local_2 = 1;
        local_1a = 0x17;
      }
      else {
        if (((iVar1 < 9) || (0xc < iVar1)) && (iVar1 != 0x20)) {
          return _Var2;
        }
        local_2 = 1;
        local_1a = 0x16;
      }
      break;
    case 9:
      *(undefined2 *)(in_RDI + 1) = 0x8b;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 10:
      if (iVar1 != 0x61) {
        return _Var2;
      }
      local_1a = 0x18;
      break;
    case 0xb:
      if (iVar1 == 0x65) {
        local_1a = 0x19;
      }
      else {
        if (iVar1 != 0x6f) {
          return _Var2;
        }
        local_1a = 0x1a;
      }
      break;
    case 0xc:
      if (iVar1 == 0x6c) {
        local_1a = 0x1b;
      }
      else {
        if (iVar1 != 0x78) {
          return _Var2;
        }
        local_1a = 0x1c;
      }
      break;
    case 0xd:
      if (iVar1 == 0x69) {
        local_1a = 0x1d;
      }
      else if (iVar1 == 0x6f) {
        local_1a = 0x1e;
      }
      else {
        if (iVar1 != 0x75) {
          return _Var2;
        }
        local_1a = 0x1f;
      }
      break;
    case 0xe:
      if (iVar1 != 0x66) {
        return _Var2;
      }
      local_1a = 0x20;
      break;
    case 0xf:
      *(undefined2 *)(in_RDI + 1) = 0x8c;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x10:
      if (iVar1 != 0x6f) {
        return _Var2;
      }
      local_1a = 0x21;
      break;
    case 0x11:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x22;
      break;
    case 0x12:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x23;
      break;
    case 0x13:
      if (iVar1 == 0x68) {
        local_1a = 0x24;
      }
      else {
        if (iVar1 != 0x79) {
          return _Var2;
        }
        local_1a = 0x25;
      }
      break;
    case 0x14:
      _Var2 = true;
      *(undefined2 *)(in_RDI + 1) = 0x84;
      (**(code **)(in_RDI + 4))(in_RDI);
      if (iVar1 != 0x6e) {
        return true;
      }
      local_1a = 0x26;
      uVar3 = extraout_RDX_00;
      break;
    case 0x15:
      if (iVar1 != 0x68) {
        return _Var2;
      }
      local_1a = 0x27;
      break;
    case 0x16:
      if (iVar1 == 0x5c) {
        local_2 = 1;
        local_1a = 8;
      }
      else if (iVar1 == 99) {
        local_1a = 10;
      }
      else if (iVar1 == 100) {
        local_1a = 0xb;
      }
      else if (iVar1 == 0x65) {
        local_1a = 0xc;
      }
      else if (iVar1 == 0x66) {
        local_1a = 0xd;
      }
      else if (iVar1 == 0x69) {
        local_1a = 0xe;
      }
      else if (iVar1 == 0x6c) {
        local_1a = 0x10;
      }
      else if (iVar1 == 0x72) {
        local_1a = 0x11;
      }
      else if (iVar1 == 0x73) {
        local_1a = 0x12;
      }
      else if (iVar1 == 0x74) {
        local_1a = 0x13;
      }
      else if (iVar1 == 0x75) {
        local_1a = 0x28;
      }
      else if (iVar1 == 0x77) {
        local_1a = 0x15;
      }
      else {
        if (((iVar1 < 9) || (0xd < iVar1)) && (iVar1 != 0x20)) {
          return _Var2;
        }
        local_2 = 1;
        local_1a = 0x16;
      }
      break;
    case 0x17:
      if (iVar1 != 10) {
        return _Var2;
      }
      local_2 = 1;
      local_1a = 0x16;
      break;
    case 0x18:
      if (iVar1 != 0x73) {
        return _Var2;
      }
      local_1a = 0x29;
      break;
    case 0x19:
      if (iVar1 != 99) {
        return _Var2;
      }
      local_1a = 0x2a;
      break;
    case 0x1a:
      _Var2 = true;
      *(undefined2 *)(in_RDI + 1) = 0x31;
      (**(code **)(in_RDI + 4))(in_RDI);
      if (iVar1 != 0x6e) {
        return true;
      }
      local_1a = 0x2b;
      uVar3 = extraout_RDX_01;
      break;
    case 0x1b:
      if (iVar1 == 0x69) {
        local_1a = 0x2c;
      }
      else {
        if (iVar1 != 0x73) {
          return _Var2;
        }
        local_1a = 0x2d;
      }
      break;
    case 0x1c:
      if (iVar1 != 0x70) {
        return _Var2;
      }
      local_1a = 0x2e;
      break;
    case 0x1d:
      *(undefined2 *)(in_RDI + 1) = 0x35;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x1e:
      if (iVar1 != 0x72) {
        return _Var2;
      }
      local_1a = 0x2f;
      break;
    case 0x1f:
      if (iVar1 != 0x6e) {
        return _Var2;
      }
      local_1a = 0x30;
      break;
    case 0x20:
      *(undefined2 *)(in_RDI + 1) = 0x33;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x21:
      if (iVar1 != 99) {
        return _Var2;
      }
      local_1a = 0x31;
      break;
    case 0x22:
      if (iVar1 != 0x61) {
        return _Var2;
      }
      local_1a = 0x32;
      break;
    case 0x23:
      if (iVar1 != 0x6c) {
        return _Var2;
      }
      local_1a = 0x33;
      break;
    case 0x24:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x34;
      break;
    case 0x25:
      if (iVar1 != 0x70) {
        return _Var2;
      }
      local_1a = 0x35;
      break;
    case 0x26:
      if (iVar1 == 0x73) {
        local_1a = 0x36;
      }
      else {
        if (iVar1 != 0x74) {
          return _Var2;
        }
        local_1a = 0x37;
      }
      break;
    case 0x27:
      if (iVar1 != 0x69) {
        return _Var2;
      }
      local_1a = 0x38;
      break;
    case 0x28:
      if (iVar1 != 0x6e) {
        return _Var2;
      }
      local_1a = 0x26;
      break;
    case 0x29:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x39;
      break;
    case 0x2a:
      if (iVar1 != 0x6c) {
        return _Var2;
      }
      local_1a = 0x3a;
      break;
    case 0x2b:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x3b;
      break;
    case 0x2c:
      if (iVar1 != 0x66) {
        return _Var2;
      }
      local_1a = 0x3c;
      break;
    case 0x2d:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x3d;
      break;
    case 0x2e:
      if (iVar1 != 0x6f) {
        return _Var2;
      }
      local_1a = 0x3e;
      break;
    case 0x2f:
      *(undefined2 *)(in_RDI + 1) = 2;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x30:
      if (iVar1 != 99) {
        return _Var2;
      }
      local_1a = 0x3f;
      break;
    case 0x31:
      if (iVar1 != 0x61) {
        return _Var2;
      }
      local_1a = 0x40;
      break;
    case 0x32:
      if (iVar1 != 100) {
        return _Var2;
      }
      local_1a = 0x41;
      break;
    case 0x33:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x42;
      break;
    case 0x34:
      if (iVar1 != 0x6e) {
        return _Var2;
      }
      local_1a = 0x43;
      break;
    case 0x35:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x44;
      break;
    case 0x36:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x45;
      break;
    case 0x37:
      if (iVar1 != 0x69) {
        return _Var2;
      }
      local_1a = 0x46;
      break;
    case 0x38:
      if (iVar1 != 0x6c) {
        return _Var2;
      }
      local_1a = 0x47;
      break;
    case 0x39:
      *(undefined2 *)(in_RDI + 1) = 0x38;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x3a:
      if (iVar1 != 0x61) {
        return _Var2;
      }
      local_1a = 0x48;
      break;
    case 0x3b:
      *(undefined2 *)(in_RDI + 1) = 0x32;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x3c:
      *(undefined2 *)(in_RDI + 1) = 0x36;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x3d:
      *(undefined2 *)(in_RDI + 1) = 0x37;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x3e:
      if (iVar1 != 0x72) {
        return _Var2;
      }
      local_1a = 0x49;
      break;
    case 0x3f:
      if (iVar1 != 0x74) {
        return _Var2;
      }
      local_1a = 0x4a;
      break;
    case 0x40:
      if (iVar1 != 0x6c) {
        return _Var2;
      }
      local_1a = 0x4b;
      break;
    case 0x41:
      if (iVar1 != 0x6f) {
        return _Var2;
      }
      local_1a = 0x4c;
      break;
    case 0x42:
      if (iVar1 != 99) {
        return _Var2;
      }
      local_1a = 0x4d;
      break;
    case 0x43:
      *(undefined2 *)(in_RDI + 1) = 0x34;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x44:
      if (iVar1 != 0x73) {
        return _Var2;
      }
      local_1a = 0x4e;
      break;
    case 0x45:
      if (iVar1 != 0x74) {
        return _Var2;
      }
      local_1a = 0x4f;
      break;
    case 0x46:
      if (iVar1 != 0x6c) {
        return _Var2;
      }
      local_1a = 0x50;
      break;
    case 0x47:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x51;
      break;
    case 0x48:
      if (iVar1 != 0x72) {
        return _Var2;
      }
      local_1a = 0x52;
      break;
    case 0x49:
      if (iVar1 != 0x74) {
        return _Var2;
      }
      local_1a = 0x53;
      break;
    case 0x4a:
      if (iVar1 != 0x69) {
        return _Var2;
      }
      local_1a = 0x54;
      break;
    case 0x4b:
      *(undefined2 *)(in_RDI + 1) = 0x4a;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x4c:
      if (iVar1 != 0x6e) {
        return _Var2;
      }
      local_1a = 0x55;
      break;
    case 0x4d:
      if (iVar1 != 0x74) {
        return _Var2;
      }
      local_1a = 0x56;
      break;
    case 0x4e:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x57;
      break;
    case 0x4f:
      _Var2 = true;
      *(undefined2 *)(in_RDI + 1) = 0x4b;
      (**(code **)(in_RDI + 4))(in_RDI);
      if (iVar1 != 0x65) {
        return true;
      }
      local_1a = 0x58;
      uVar3 = extraout_RDX_02;
      break;
    case 0x50:
      *(undefined2 *)(in_RDI + 1) = 0x30;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x51:
      *(undefined2 *)(in_RDI + 1) = 0x2f;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x52:
      if (iVar1 != 0x65) {
        return _Var2;
      }
      local_1a = 0x59;
      break;
    case 0x53:
      *(undefined2 *)(in_RDI + 1) = 0x48;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x54:
      if (iVar1 != 0x6f) {
        return _Var2;
      }
      local_1a = 0x5a;
      break;
    case 0x55:
      if (iVar1 != 0x6c) {
        return _Var2;
      }
      local_1a = 0x5b;
      break;
    case 0x56:
      *(undefined2 *)(in_RDI + 1) = 3;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x57:
      if (iVar1 != 0x74) {
        return _Var2;
      }
      local_1a = 0x5c;
      break;
    case 0x58:
      if (iVar1 != 0x6e) {
        return _Var2;
      }
      local_1a = 0x5d;
      break;
    case 0x59:
      *(undefined2 *)(in_RDI + 1) = 0x46;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x5a:
      if (iVar1 != 0x6e) {
        return _Var2;
      }
      local_1a = 0x5e;
      break;
    case 0x5b:
      if (iVar1 != 0x79) {
        return _Var2;
      }
      local_1a = 0x5f;
      break;
    case 0x5c:
      *(undefined2 *)(in_RDI + 1) = 0x47;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x5d:
      if (iVar1 != 0x76) {
        return _Var2;
      }
      local_1a = 0x60;
      break;
    case 0x5e:
      *(undefined2 *)(in_RDI + 1) = 0x3d;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x5f:
      *(undefined2 *)(in_RDI + 1) = 0x49;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    case 0x60:
      *(undefined2 *)(in_RDI + 1) = 0x4c;
      (**(code **)(in_RDI + 4))(in_RDI);
      return true;
    default:
      return false;
    }
    (**(code **)(in_RDI + 2))(in_RDI,local_2,uVar3,local_2);
  } while( true );
}

Assistant:

static bool ts_lex_keywords(TSLexer *lexer, TSStateId state) {
  START_LEXER();
  eof = lexer->eof(lexer);
  switch (state) {
    case 0:
      if (lookahead == 'A') ADVANCE(1);
      if (lookahead == 'E') ADVANCE(2);
      if (lookahead == 'K') ADVANCE(3);
      if (lookahead == 'L') ADVANCE(4);
      if (lookahead == 'P') ADVANCE(5);
      if (lookahead == 'Q') ADVANCE(6);
      if (lookahead == 'U') ADVANCE(7);
      if (lookahead == '\\') SKIP(8);
      if (lookahead == 'a') ADVANCE(9);
      if (lookahead == 'c') ADVANCE(10);
      if (lookahead == 'd') ADVANCE(11);
      if (lookahead == 'e') ADVANCE(12);
      if (lookahead == 'f') ADVANCE(13);
      if (lookahead == 'i') ADVANCE(14);
      if (lookahead == 'k') ADVANCE(15);
      if (lookahead == 'l') ADVANCE(16);
      if (lookahead == 'r') ADVANCE(17);
      if (lookahead == 's') ADVANCE(18);
      if (lookahead == 't') ADVANCE(19);
      if (lookahead == 'u') ADVANCE(20);
      if (lookahead == 'w') ADVANCE(21);
      if (('\t' <= lookahead && lookahead <= '\r') ||
          lookahead == ' ') SKIP(22);
      END_STATE();
    case 1:
      ACCEPT_TOKEN(anon_sym_A);
      END_STATE();
    case 2:
      ACCEPT_TOKEN(anon_sym_E);
      END_STATE();
    case 3:
      ACCEPT_TOKEN(anon_sym_K);
      END_STATE();
    case 4:
      ACCEPT_TOKEN(anon_sym_L);
      END_STATE();
    case 5:
      ACCEPT_TOKEN(anon_sym_P);
      END_STATE();
    case 6:
      ACCEPT_TOKEN(anon_sym_Q);
      END_STATE();
    case 7:
      ACCEPT_TOKEN(anon_sym_U);
      END_STATE();
    case 8:
      if (lookahead == '\r') SKIP(23);
      if (('\t' <= lookahead && lookahead <= '\f') ||
          lookahead == ' ') SKIP(22);
      END_STATE();
    case 9:
      ACCEPT_TOKEN(anon_sym_a);
      END_STATE();
    case 10:
      if (lookahead == 'a') ADVANCE(24);
      END_STATE();
    case 11:
      if (lookahead == 'e') ADVANCE(25);
      if (lookahead == 'o') ADVANCE(26);
      END_STATE();
    case 12:
      if (lookahead == 'l') ADVANCE(27);
      if (lookahead == 'x') ADVANCE(28);
      END_STATE();
    case 13:
      if (lookahead == 'i') ADVANCE(29);
      if (lookahead == 'o') ADVANCE(30);
      if (lookahead == 'u') ADVANCE(31);
      END_STATE();
    case 14:
      if (lookahead == 'f') ADVANCE(32);
      END_STATE();
    case 15:
      ACCEPT_TOKEN(anon_sym_k);
      END_STATE();
    case 16:
      if (lookahead == 'o') ADVANCE(33);
      END_STATE();
    case 17:
      if (lookahead == 'e') ADVANCE(34);
      END_STATE();
    case 18:
      if (lookahead == 'e') ADVANCE(35);
      END_STATE();
    case 19:
      if (lookahead == 'h') ADVANCE(36);
      if (lookahead == 'y') ADVANCE(37);
      END_STATE();
    case 20:
      ACCEPT_TOKEN(anon_sym_u);
      if (lookahead == 'n') ADVANCE(38);
      END_STATE();
    case 21:
      if (lookahead == 'h') ADVANCE(39);
      END_STATE();
    case 22:
      if (lookahead == '\\') SKIP(8);
      if (lookahead == 'c') ADVANCE(10);
      if (lookahead == 'd') ADVANCE(11);
      if (lookahead == 'e') ADVANCE(12);
      if (lookahead == 'f') ADVANCE(13);
      if (lookahead == 'i') ADVANCE(14);
      if (lookahead == 'l') ADVANCE(16);
      if (lookahead == 'r') ADVANCE(17);
      if (lookahead == 's') ADVANCE(18);
      if (lookahead == 't') ADVANCE(19);
      if (lookahead == 'u') ADVANCE(40);
      if (lookahead == 'w') ADVANCE(21);
      if (('\t' <= lookahead && lookahead <= '\r') ||
          lookahead == ' ') SKIP(22);
      END_STATE();
    case 23:
      if (lookahead == '\n') SKIP(22);
      END_STATE();
    case 24:
      if (lookahead == 's') ADVANCE(41);
      END_STATE();
    case 25:
      if (lookahead == 'c') ADVANCE(42);
      END_STATE();
    case 26:
      ACCEPT_TOKEN(anon_sym_do);
      if (lookahead == 'n') ADVANCE(43);
      END_STATE();
    case 27:
      if (lookahead == 'i') ADVANCE(44);
      if (lookahead == 's') ADVANCE(45);
      END_STATE();
    case 28:
      if (lookahead == 'p') ADVANCE(46);
      END_STATE();
    case 29:
      ACCEPT_TOKEN(anon_sym_fi);
      END_STATE();
    case 30:
      if (lookahead == 'r') ADVANCE(47);
      END_STATE();
    case 31:
      if (lookahead == 'n') ADVANCE(48);
      END_STATE();
    case 32:
      ACCEPT_TOKEN(anon_sym_if);
      END_STATE();
    case 33:
      if (lookahead == 'c') ADVANCE(49);
      END_STATE();
    case 34:
      if (lookahead == 'a') ADVANCE(50);
      END_STATE();
    case 35:
      if (lookahead == 'l') ADVANCE(51);
      END_STATE();
    case 36:
      if (lookahead == 'e') ADVANCE(52);
      END_STATE();
    case 37:
      if (lookahead == 'p') ADVANCE(53);
      END_STATE();
    case 38:
      if (lookahead == 's') ADVANCE(54);
      if (lookahead == 't') ADVANCE(55);
      END_STATE();
    case 39:
      if (lookahead == 'i') ADVANCE(56);
      END_STATE();
    case 40:
      if (lookahead == 'n') ADVANCE(38);
      END_STATE();
    case 41:
      if (lookahead == 'e') ADVANCE(57);
      END_STATE();
    case 42:
      if (lookahead == 'l') ADVANCE(58);
      END_STATE();
    case 43:
      if (lookahead == 'e') ADVANCE(59);
      END_STATE();
    case 44:
      if (lookahead == 'f') ADVANCE(60);
      END_STATE();
    case 45:
      if (lookahead == 'e') ADVANCE(61);
      END_STATE();
    case 46:
      if (lookahead == 'o') ADVANCE(62);
      END_STATE();
    case 47:
      ACCEPT_TOKEN(anon_sym_for);
      END_STATE();
    case 48:
      if (lookahead == 'c') ADVANCE(63);
      END_STATE();
    case 49:
      if (lookahead == 'a') ADVANCE(64);
      END_STATE();
    case 50:
      if (lookahead == 'd') ADVANCE(65);
      END_STATE();
    case 51:
      if (lookahead == 'e') ADVANCE(66);
      END_STATE();
    case 52:
      if (lookahead == 'n') ADVANCE(67);
      END_STATE();
    case 53:
      if (lookahead == 'e') ADVANCE(68);
      END_STATE();
    case 54:
      if (lookahead == 'e') ADVANCE(69);
      END_STATE();
    case 55:
      if (lookahead == 'i') ADVANCE(70);
      END_STATE();
    case 56:
      if (lookahead == 'l') ADVANCE(71);
      END_STATE();
    case 57:
      ACCEPT_TOKEN(anon_sym_case);
      END_STATE();
    case 58:
      if (lookahead == 'a') ADVANCE(72);
      END_STATE();
    case 59:
      ACCEPT_TOKEN(anon_sym_done);
      END_STATE();
    case 60:
      ACCEPT_TOKEN(anon_sym_elif);
      END_STATE();
    case 61:
      ACCEPT_TOKEN(anon_sym_else);
      END_STATE();
    case 62:
      if (lookahead == 'r') ADVANCE(73);
      END_STATE();
    case 63:
      if (lookahead == 't') ADVANCE(74);
      END_STATE();
    case 64:
      if (lookahead == 'l') ADVANCE(75);
      END_STATE();
    case 65:
      if (lookahead == 'o') ADVANCE(76);
      END_STATE();
    case 66:
      if (lookahead == 'c') ADVANCE(77);
      END_STATE();
    case 67:
      ACCEPT_TOKEN(anon_sym_then);
      END_STATE();
    case 68:
      if (lookahead == 's') ADVANCE(78);
      END_STATE();
    case 69:
      if (lookahead == 't') ADVANCE(79);
      END_STATE();
    case 70:
      if (lookahead == 'l') ADVANCE(80);
      END_STATE();
    case 71:
      if (lookahead == 'e') ADVANCE(81);
      END_STATE();
    case 72:
      if (lookahead == 'r') ADVANCE(82);
      END_STATE();
    case 73:
      if (lookahead == 't') ADVANCE(83);
      END_STATE();
    case 74:
      if (lookahead == 'i') ADVANCE(84);
      END_STATE();
    case 75:
      ACCEPT_TOKEN(anon_sym_local);
      END_STATE();
    case 76:
      if (lookahead == 'n') ADVANCE(85);
      END_STATE();
    case 77:
      if (lookahead == 't') ADVANCE(86);
      END_STATE();
    case 78:
      if (lookahead == 'e') ADVANCE(87);
      END_STATE();
    case 79:
      ACCEPT_TOKEN(anon_sym_unset);
      if (lookahead == 'e') ADVANCE(88);
      END_STATE();
    case 80:
      ACCEPT_TOKEN(anon_sym_until);
      END_STATE();
    case 81:
      ACCEPT_TOKEN(anon_sym_while);
      END_STATE();
    case 82:
      if (lookahead == 'e') ADVANCE(89);
      END_STATE();
    case 83:
      ACCEPT_TOKEN(anon_sym_export);
      END_STATE();
    case 84:
      if (lookahead == 'o') ADVANCE(90);
      END_STATE();
    case 85:
      if (lookahead == 'l') ADVANCE(91);
      END_STATE();
    case 86:
      ACCEPT_TOKEN(anon_sym_select);
      END_STATE();
    case 87:
      if (lookahead == 't') ADVANCE(92);
      END_STATE();
    case 88:
      if (lookahead == 'n') ADVANCE(93);
      END_STATE();
    case 89:
      ACCEPT_TOKEN(anon_sym_declare);
      END_STATE();
    case 90:
      if (lookahead == 'n') ADVANCE(94);
      END_STATE();
    case 91:
      if (lookahead == 'y') ADVANCE(95);
      END_STATE();
    case 92:
      ACCEPT_TOKEN(anon_sym_typeset);
      END_STATE();
    case 93:
      if (lookahead == 'v') ADVANCE(96);
      END_STATE();
    case 94:
      ACCEPT_TOKEN(anon_sym_function);
      END_STATE();
    case 95:
      ACCEPT_TOKEN(anon_sym_readonly);
      END_STATE();
    case 96:
      ACCEPT_TOKEN(anon_sym_unsetenv);
      END_STATE();
    default:
      return false;
  }
}